

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void do_ext64(DisasContext_conflict1 *s,TCGv_i64 tcg_left,TCGv_i64 tcg_right,int pos)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *ts;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  if (pos < 0x40) {
    tcg_gen_shri_i64_aarch64(s_00,tcg_right,tcg_right,(ulong)(uint)pos);
    tcg_gen_shli_i64_aarch64(s_00,(TCGv_i64)((long)ts - (long)s_00),tcg_left,(ulong)(0x40 - pos));
    tcg_gen_op3_aarch64(s_00,INDEX_op_or_i64,(TCGArg)(tcg_right + (long)s_00),
                        (TCGArg)(tcg_right + (long)s_00),(TCGArg)ts);
    tcg_temp_free_internal_aarch64(s_00,ts);
    return;
  }
  __assert_fail("pos > 0 && pos < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x1bf0,"void do_ext64(DisasContext *, TCGv_i64, TCGv_i64, int)");
}

Assistant:

static void do_ext64(DisasContext *s, TCGv_i64 tcg_left, TCGv_i64 tcg_right,
                     int pos)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Extract 64 bits from the middle of two concatenated 64 bit
     * vector register slices left:right. The extracted bits start
     * at 'pos' bits into the right (least significant) side.
     * We return the result in tcg_right, and guarantee not to
     * trash tcg_left.
     */
    TCGv_i64 tcg_tmp = tcg_temp_new_i64(tcg_ctx);
    assert(pos > 0 && pos < 64);

    tcg_gen_shri_i64(tcg_ctx, tcg_right, tcg_right, pos);
    tcg_gen_shli_i64(tcg_ctx, tcg_tmp, tcg_left, 64 - pos);
    tcg_gen_or_i64(tcg_ctx, tcg_right, tcg_right, tcg_tmp);

    tcg_temp_free_i64(tcg_ctx, tcg_tmp);
}